

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O0

QDebug operator<<(QDebug *s,QNetworkCookie *cookie)

{
  QDebug *pQVar1;
  QByteArray *t;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff8f;
  Stream *this;
  undefined4 in_stack_ffffffffffffffd8;
  RawForm in_stack_ffffffffffffffdc;
  QNetworkCookie *in_stack_ffffffffffffffe0;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  pQVar1 = (QDebug *)QDebug::resetFormat();
  QDebug::nospace(pQVar1);
  t = (QByteArray *)
      QDebug::operator<<((QDebug *)this,
                         (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  pQVar1 = (QDebug *)&stack0xffffffffffffffd8;
  QNetworkCookie::toRawForm(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  QDebug::operator<<(pQVar1,t);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff8f);
  QByteArray::~QByteArray((QByteArray *)0x1b54bc);
  QDebug::QDebug((QDebug *)in_RDI,
                 (QDebug *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug s, const QNetworkCookie &cookie)
{
    QDebugStateSaver saver(s);
    s.resetFormat().nospace();
    s << "QNetworkCookie(" << cookie.toRawForm(QNetworkCookie::Full) << ')';
    return s;
}